

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportInstallFileGenerator::GenerateImportTargetsConfig
          (cmExportInstallFileGenerator *this,ostream *os,string *config,string *suffix)

{
  cmExportSet *pcVar1;
  pointer puVar2;
  cmTargetExport *pcVar3;
  TargetType TVar4;
  cmGeneratorTarget *pcVar5;
  pointer puVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  importedLocations;
  ImportPropertyMap properties;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  pcVar1 = this->IEGen->ExportSet;
  puVar6 = (pcVar1->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (pcVar1->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar2) {
    do {
      pcVar3 = (puVar6->_M_t).
               super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
               super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
               super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
      pcVar5 = pcVar3->Target;
      TVar4 = cmGeneratorTarget::GetType(pcVar5);
      if (TVar4 == OBJECT_LIBRARY) {
        TVar4 = (uint)(pcVar3->ObjectsGenerator == (cmInstallTargetGenerator *)0x0) * 3 +
                OBJECT_LIBRARY;
      }
      if (TVar4 != INTERFACE_LIBRARY) {
        local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_60._M_impl.super__Rb_tree_header._M_header;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_90._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_90._M_impl.super__Rb_tree_header._M_header;
        local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_90._M_impl.super__Rb_tree_header._M_header._M_right =
             local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar5,config,suffix,
                   ((puVar6->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->ArchiveGenerator,
                   (ImportPropertyMap *)&local_60,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar5,config,suffix,
                   ((puVar6->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->LibraryGenerator,
                   (ImportPropertyMap *)&local_60,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar5,config,suffix,
                   ((puVar6->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->RuntimeGenerator,
                   (ImportPropertyMap *)&local_60,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar5,config,suffix,
                   ((puVar6->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->ObjectsGenerator,
                   (ImportPropertyMap *)&local_60,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar5,config,suffix,
                   ((puVar6->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->FrameworkGenerator
                   ,(ImportPropertyMap *)&local_60,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar5,config,suffix,
                   ((puVar6->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->BundleGenerator,
                   (ImportPropertyMap *)&local_60,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90);
        if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
          pcVar5 = ((puVar6->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target;
          cmExportFileGenerator::SetImportDetailProperties
                    (&this->super_cmExportFileGenerator,config,suffix,pcVar5,
                     (ImportPropertyMap *)&local_60);
          cmExportFileGenerator::SetImportLinkInterface
                    (&this->super_cmExportFileGenerator,config,suffix,InstallInterface,pcVar5,
                     (ImportPropertyMap *)&local_60);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                    (this,os,config,pcVar5,&local_60);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[8])
                    (this,os,pcVar5,&local_60,&local_90);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_90);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_60);
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix)
{
  // Add each target in the set to the export.
  for (std::unique_ptr<cmTargetExport> const& te :
       this->IEGen->GetExportSet()->GetTargetExports()) {
    // Collect import properties for this target.
    if (this->GetExportTargetType(te.get()) ==
        cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    ImportPropertyMap properties;
    std::set<std::string> importedLocations;

    this->SetImportLocationProperty(config, suffix, te->ArchiveGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->LibraryGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->RuntimeGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->ObjectsGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->FrameworkGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->BundleGenerator,
                                    properties, importedLocations);

    // If any file location was set for the target add it to the
    // import file.
    if (!properties.empty()) {
      // Get the rest of the target details.
      cmGeneratorTarget* gtgt = te->Target;
      this->SetImportDetailProperties(config, suffix, gtgt, properties);

      this->SetImportLinkInterface(config, suffix,
                                   cmGeneratorExpression::InstallInterface,
                                   gtgt, properties);

      // TODO: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      this->GenerateImportPropertyCode(os, config, gtgt, properties);
      this->GenerateImportedFileChecksCode(os, gtgt, properties,
                                           importedLocations);
    }
  }
}